

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool __thiscall
picojson::default_parse_context::
parse_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (default_parse_context *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  _Base_ptr *pp_Var1;
  byte bVar2;
  int iVar3;
  value *pvVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *this_00;
  _storage out;
  byte *pbVar5;
  bool bVar6;
  string *psVar7;
  byte *pbVar8;
  runtime_error *this_01;
  ulong uVar9;
  
  psVar7 = (string *)operator_new(0x20);
  (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
  psVar7->_M_string_length = 0;
  (psVar7->field_2)._M_local_buf[0] = '\0';
  pvVar4 = this->out_;
  iVar3 = pvVar4->type_;
  pvVar4->type_ = 3;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             *)(pvVar4->u_).array_;
  (pvVar4->u_).string_ = psVar7;
  if (iVar3 == 5) {
    uVar9 = 0x30;
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
      ::~_Rb_tree(this_00);
    }
  }
  else if (iVar3 == 4) {
    uVar9 = 0x18;
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00);
    }
  }
  else {
    if (iVar3 != 3) goto LAB_001084c6;
    uVar9 = 0x20;
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      pp_Var1 = &(this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
      if ((_Base_ptr *)*(undefined1 **)&this_00->_M_impl != pp_Var1) {
        operator_delete(*(undefined1 **)&this_00->_M_impl,(ulong)((long)&(*pp_Var1)->_M_color + 1));
      }
    }
  }
  operator_delete(this_00,uVar9);
LAB_001084c6:
  if (this->out_->type_ != 3) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"\"type mismatch! call is<type>() before get<type>()\" && is<std::string>()")
    ;
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  out = this->out_->u_;
LAB_001084dd:
  do {
    pbVar8 = (byte *)(in->cur_)._M_current;
    if (in->consumed_ == true) {
      if (*pbVar8 == 10) {
        in->line_ = in->line_ + 1;
      }
      pbVar8 = pbVar8 + 1;
      (in->cur_)._M_current = (char *)pbVar8;
    }
    pbVar5 = (byte *)(in->end_)._M_current;
    if (pbVar8 == pbVar5) {
LAB_0010859c:
      in->consumed_ = false;
      return false;
    }
    in->consumed_ = true;
    bVar2 = *pbVar8;
    if (bVar2 < 0x20) goto LAB_0010859c;
    if (bVar2 != 0x5c) {
      if (bVar2 == 0x22) {
        return true;
      }
      goto LAB_0010851f;
    }
    pbVar8 = pbVar8 + 1;
    (in->cur_)._M_current = (char *)pbVar8;
    if (pbVar8 == pbVar5) goto LAB_0010859c;
    in->consumed_ = true;
    bVar2 = *pbVar8;
    if (bVar2 < 0x62) {
      if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) {
        return false;
      }
      goto LAB_0010851f;
    }
    switch(bVar2) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      return false;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x75:
      goto switchD_00108567_caseD_7;
    default:
      if ((bVar2 != 0x66) && (bVar2 != 0x62)) {
        return false;
      }
    }
LAB_0010851f:
    std::__cxx11::string::push_back(out.boolean_);
  } while( true );
switchD_00108567_caseD_7:
  bVar6 = _parse_codepoint<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (out.string_,in);
  if (!bVar6) {
    return false;
  }
  goto LAB_001084dd;
}

Assistant:

bool parse_string(input<Iter> &in) {
    *out_ = value(string_type, false);
    return _parse_string(out_->get<std::string>(), in);
  }